

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O1

void usage(char **argv)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  __s = *argv;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x128138);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," options",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "This program creates random VPack or JSON structures and validates them. (Default: VPack)"
             ,0x59);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available format options are:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," --vpack                create VPack",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," --json                 create JSON",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --evil                 purposefully fuzz generated VPack, to test for crashes",0x4e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --iterations <number>  number of iterations (number > 0). Default: 1",0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --threads <number>     number of threads (number > 0). Default: 1",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --seed <number>        number that will be used as seed for random generation (number >= 0). Default: random value"
             ,0x73);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

static void usage(char const* argv[]) {
  std::cout << "Usage: " << argv[0] << " options" << std::endl;
  std::cout << "This program creates random VPack or JSON structures and "
               "validates them. (Default: VPack)"
            << std::endl;
  std::cout << "Available format options are:" << std::endl;
  std::cout << " --vpack                create VPack" << std::endl;
  std::cout << " --json                 create JSON" << std::endl;
  std::cout << " --evil                 purposefully fuzz generated VPack, to "
               "test for crashes"
            << std::endl;
  std::cout
      << " --iterations <number>  number of iterations (number > 0). Default: 1"
      << std::endl;
  std::cout
      << " --threads <number>     number of threads (number > 0). Default: 1"
      << std::endl;
  std::cout << " --seed <number>        number that will be used as seed for "
               "random generation (number >= 0). Default: random value"
            << std::endl;
  std::cout << std::endl;
}